

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O2

int linfload(osfildef *fp,dbgcxdef *dbgctx,errcxdef *ec,tokpdef *path)

{
  size_t sVar1;
  linfdef *plVar2;
  uchar *puVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  mcmon *nump;
  bool bVar7;
  uchar buf [261];
  
  sVar1 = fread(buf,6,1,(FILE *)fp);
  iVar5 = 1;
  if (sVar1 == 1) {
    puVar3 = buf + 6;
    sVar1 = fread(puVar3,(ulong)buf[1],1,(FILE *)fp);
    if (sVar1 == 1) {
      plVar2 = linfini(dbgctx->dbgcxmem,ec,(char *)puVar3,(uint)buf[1],path,0,0);
      if (plVar2 == (linfdef *)0x0) {
        pcVar4 = errstr(ec,(char *)puVar3,(uint)buf[1]);
        ec->errcxptr->erraav[0].errastr = pcVar4;
        ec->errcxptr->erraac = 1;
        errlogn(ec,0x7db,"TADS");
      }
      else {
        if ((FILE *)plVar2->linffp != (FILE *)0x0) {
          fclose((FILE *)plVar2->linffp);
          plVar2->linffp = (osfildef *)0x0;
        }
        (plVar2->linflin).linnxt = dbgctx->dbgcxlin;
        dbgctx->dbgcxlin = &plVar2->linflin;
        (plVar2->linflin).linid = (uint)buf[0];
        uVar6 = (ulong)(uint)buf._2_4_;
        plVar2->linfcrec = uVar6;
        if (dbgctx->dbgcxfid <= (int)(uint)buf[0]) {
          dbgctx->dbgcxfid = buf[0] + 1;
          uVar6 = plVar2->linfcrec;
        }
        if (uVar6 != 0) {
          iVar5 = (int)(uVar6 - 1 >> 10) + 1;
          nump = plVar2->linfpg;
          while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
            puVar3 = mcmalo0(plVar2->linfmem,0x1000,nump,0xffff,0);
            sVar1 = fread(puVar3,0x1000,1,(FILE *)fp);
            if (sVar1 != 1) {
              return 1;
            }
            mcmunlck(plVar2->linfmem,*nump);
            nump = nump + 1;
          }
        }
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int linfload(osfildef *fp, dbgcxdef *dbgctx, errcxdef *ec, tokpdef *path)
{
    linfdef *linf;
    uchar    buf[UCHAR_MAX + 6];
    uint     pgcnt;
    uchar   *objp;
    mcmon   *objn;
    
    /* read the source's description from the file */
    if (osfrb(fp, buf, 6)
        || osfrb(fp, buf + 6, (int)buf[1]))
        return TRUE;
    
    /* initialize the linfdef */
    if (!(linf = linfini(dbgctx->dbgcxmem, ec, (char *)buf + 6,
                         (int)buf[1], path, FALSE, FALSE)))
    {
        errlog1(ec, ERR_NOSOURC, ERRTSTR,
                errstr(ec, (char *)buf+6, (int)buf[1]));
        return TRUE;
    }
    
    /* if we opened the file, close it - don't hold all files open */
    if (linf->linffp != 0)
    {
        osfcls(linf->linffp);
        linf->linffp = 0;
    }
    
    /* link into debug line source chain */
    linf->linflin.linnxt = dbgctx->dbgcxlin;
    dbgctx->dbgcxlin = &linf->linflin;
    linf->linflin.linid = buf[0];
    linf->linfcrec = osrp4(buf + 2);
    
    /* make sure the max line id is set above current line */
    if (buf[0] >= dbgctx->dbgcxfid)
        dbgctx->dbgcxfid = buf[0] + 1;
    
    /* make sure we have some debug records */
    if (!linf->linfcrec)
        return FALSE;

    /* figure number of pages */
    pgcnt = 1 + ((linf->linfcrec - 1) >> 10);
    
    /* allocate and read the debug source pages */
    for (objn = linf->linfpg ; pgcnt ; ++objn, --pgcnt)
    {
        objp = mcmalo(linf->linfmem, (ushort)(1024 * DBGLINFSIZ), objn);
        if (osfrb(fp, objp, (1024 * DBGLINFSIZ))) return(TRUE);
        mcmunlck(linf->linfmem, *objn);
    }

    /* success */
    return FALSE;
}